

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O2

void console_logging_error(LogPolicy *lp,char *string)

{
  termios cf;
  termios local_54;
  
  premsg(&local_54);
  fprintf(_stderr,"%s\n",string);
  fflush(_stderr);
  postmsg(&local_54);
  return;
}

Assistant:

void console_logging_error(LogPolicy *lp, const char *string)
{
    /* Errors setting up logging are considered important, so they're
     * displayed to standard error even when not in verbose mode */
    struct termios cf;
    premsg(&cf);
    fprintf(stderr, "%s\n", string);
    fflush(stderr);
    postmsg(&cf);
}